

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_wString __thiscall ON_XMLNode::GetPathFromRoot(ON_XMLNode *this)

{
  long lVar1;
  ON_wString *pOVar2;
  long *plVar3;
  long *plVar4;
  wchar_t *wsz;
  long *in_RSI;
  
  lVar1 = in_RSI[1];
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(lVar1 + 0x40))->__data);
  pOVar2 = (ON_wString *)(**(code **)(*in_RSI + 0x18))();
  ON_wString::ON_wString((ON_wString *)this,pOVar2);
  plVar3 = (long *)(**(code **)(*in_RSI + 0x40))();
  while (plVar3 != (long *)0x0) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3);
    if (plVar4 == (long *)0x0) break;
    ON_wString::Insert((ON_wString *)this,0,L'/',1);
    pOVar2 = (ON_wString *)(**(code **)(*plVar3 + 0x18))(plVar3);
    wsz = ON_wString::operator_cast_to_wchar_t_(pOVar2);
    ON_wString::Insert((ON_wString *)this,0,wsz);
    plVar3 = plVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x40));
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLNode::GetPathFromRoot(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_wString sPath = TagName();
  PrependNodeToStringAndRecurseParents(Parent(), sPath);

  return sPath;
}